

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t>
          (LogicalType *by_type,LogicalType *type)

{
  PhysicalType PVar1;
  InternalException *this;
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  string *in_stack_ffffffffffffff88;
  allocator local_39;
  string local_38 [24];
  LogicalType *in_stack_ffffffffffffffe0;
  
  PVar1 = LogicalType::InternalType(in_RSI);
  if (PVar1 == VARCHAR) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t,duckdb::string_t>
              (in_RDX,in_stack_ffffffffffffffe0);
  }
  else if (PVar1 == INT128) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t,duckdb::hugeint_t>
              (in_RDX,in_stack_ffffffffffffffe0);
  }
  else if (PVar1 == INT32) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t,int>
              (in_RDX,in_stack_ffffffffffffffe0);
  }
  else if (PVar1 == INT64) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t,long>
              (in_RDX,in_stack_ffffffffffffffe0);
  }
  else {
    if (PVar1 != DOUBLE) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_38,"Unimplemented arg_min/arg_max by aggregate",&local_39);
      InternalException::InternalException(this,in_stack_ffffffffffffff88);
      __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
    }
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t,double>
              (in_RDX,in_stack_ffffffffffffffe0);
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetArgMinMaxFunctionBy(const LogicalType &by_type, const LogicalType &type) {
	switch (by_type.InternalType()) {
	case PhysicalType::INT32:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, int32_t>(by_type, type);
	case PhysicalType::INT64:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, int64_t>(by_type, type);
	case PhysicalType::INT128:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, hugeint_t>(by_type, type);
	case PhysicalType::DOUBLE:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, double>(by_type, type);
	case PhysicalType::VARCHAR:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, string_t>(by_type, type);
	default:
		throw InternalException("Unimplemented arg_min/arg_max by aggregate");
	}
}